

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall Message::Message(Message *this,msg_type_t _type)

{
  msg_type_t _type_local;
  Message *this_local;
  
  this->msg_type = _type;
  std::__cxx11::string::string((string *)&this->o);
  this->c = 0;
  std::__cxx11::string::string((string *)&this->d);
  this->v = 0;
  this->n = 0;
  this->i = 0;
  std::__cxx11::string::string((string *)&this->m);
  return;
}

Assistant:

Message::Message(msg_type_t _type):msg_type(_type) {
}